

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flies.cpp
# Opt level: O2

int AF_A_FlyBuzz(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  int iVar4;
  AActor *pAVar5;
  AActor *other;
  char *__assertion;
  FSoundID local_5c;
  double local_58;
  double dStack_50;
  DVector2 local_48;
  TAngle<double> local_38;
  DObject *pDStack_30;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053b827;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0053b817;
  other = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_0053b5e8;
    bVar2 = DObject::IsKindOf((DObject *)other,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0053b827;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_0053b817;
LAB_0053b5e8:
    other = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_0053b817:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0053b827;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053b827;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_0053b817;
    }
    if (((2 < (uint)numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_0053b827:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                    ,0x4d,"int AF_A_FlyBuzz(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  pAVar5 = GC::ReadBarrier<AActor>((AActor **)&other->target);
  if ((pAVar5 != (AActor *)0x0) && (((pAVar5->flags).Value & 0x100000) != 0)) {
    iVar3 = FRandom::operator()(&pr_fly);
    if (4 < iVar3) {
      AActor::AngleTo((AActor *)&local_48,other,SUB81(pAVar5,0));
      (other->Angles).Yaw.Degrees = local_48.X;
      other->args[0] = other->args[0] + 1;
      local_58 = (other->__Pos).X;
      dStack_50 = (other->__Pos).Y;
      TAngle<double>::ToVector(&stack0xffffffffffffffc8,6.0);
      local_48.Y._0_4_ = SUB84(dStack_50 + (double)pDStack_30,0);
      local_48.X = local_58 + local_38.Degrees;
      local_48.Y._4_4_ = (int)((ulong)(dStack_50 + (double)pDStack_30) >> 0x20);
      bVar2 = P_TryMove(other,&local_48,1,(secplane_t *)0x0);
      if (bVar2) {
        if ((other->args[0] & 2) != 0) {
          iVar3 = FRandom::operator()(&pr_fly);
          (other->Vel).X = (double)(iVar3 + -0x80) * 0.001953125 + (other->Vel).X;
          iVar3 = FRandom::operator()(&pr_fly);
          (other->Vel).Y = (double)(iVar3 + -0x80) * 0.001953125 + (other->Vel).Y;
        }
        iVar4 = FRandom::operator()(&pr_fly);
        iVar3 = -iVar4;
        if ((other->__Pos).Z <= (pAVar5->__Pos).Z + 5.0) {
          iVar3 = iVar4;
        }
        if (iVar4 < 0x97) {
          iVar3 = iVar4;
        }
        (other->Vel).Z = (double)iVar3 * 0.001953125;
        iVar3 = FRandom::operator()(&pr_fly);
        if (0x27 < iVar3) {
          return 0;
        }
        local_5c.ID = (other->ActiveSound).super_FSoundID.ID;
        S_Sound(other,2,&local_5c,0.5,3.0);
        return 0;
      }
      bVar2 = true;
      goto LAB_0053b69b;
    }
  }
  bVar2 = false;
LAB_0053b69b:
  AActor::SetIdle(other,bVar2);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FlyBuzz)
{
	PARAM_ACTION_PROLOGUE;

	AActor *targ = self->target;

	if (targ == NULL || !(targ->flags & MF_CORPSE) || pr_fly() < 5)
	{
		self->SetIdle();
		return 0;
	}

	self->Angles.Yaw = self->AngleTo(targ);
	self->args[0]++;
	if (!P_TryMove(self, self->Pos().XY() + self->Angles.Yaw.ToVector(6), true))
	{
		self->SetIdle(true);
		return 0;
	}
	if (self->args[0] & 2)
	{
		self->Vel.X += (pr_fly() - 128) / 512.;
		self->Vel.Y += (pr_fly() - 128) / 512.;
	}
	int zrand = pr_fly();
	if (targ->Z() + 5. < self->Z() && zrand > 150)
	{
		zrand = -zrand;
	}
	self->Vel.Z = zrand / 512.;
	if (pr_fly() < 40)
	{
		S_Sound(self, CHAN_VOICE, self->ActiveSound, 0.5f, ATTN_STATIC);
	}
	return 0;
}